

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingAdaptedStructs.cpp
# Opt level: O0

void mserialize::CustomSerializer<Derived,_void>::serialize<binlog::detail::QueueWriter>
               (Derived *t,QueueWriter *ostream)

{
  Base *in_RSI;
  QueueWriter *in_RDI;
  Derived *unaff_retaddr;
  QueueWriter *in_stack_ffffffffffffffe8;
  
  serialize<Base,binlog::detail::QueueWriter>(in_RSI,in_stack_ffffffffffffffe8);
  StructSerializer<Derived,_std::integral_constant<int_Derived::*,_&Derived::b>,_std::integral_constant<int_Derived::*,_&Derived::c>_>
  ::serialize<binlog::detail::QueueWriter>(unaff_retaddr,in_RDI);
  return;
}

Assistant:

int main()
{
  BINLOG_INFO("{}", Empty{});
  // Outputs: Empty

  BINLOG_INFO("{}", Single{123});
  // Outputs: Single{ a: 123 }

  BINLOG_INFO("{}", Pair{2, "three"});
  // Outputs: Pair{ a: 2, b: three }

  BINLOG_INFO("{}", Getter{});
  // Outputs: Getter{ a: 33, b: foo }

  BINLOG_INFO("{}", app::Namespaced{3});
  // Outputs: app::Namespaced{ a: 3, b: 2 }

  BINLOG_INFO("{}", Private{});
  // Outputs: Private{ a: 3, b: 4 }

  BINLOG_INFO("{}", Triplet<int, bool, 2>{1, true, {2,3}});
  // Outputs: Triplet{ a: 1, b: true, c: [2, 3] }

  BINLOG_INFO("{}", way);
  // Outputs: first{ business: first::First }

  //[mixed

  BINLOG_INFO("My foo: {}", Foo{1, "two"});
  // Outputs: My foo: Foo{ a: 1, b: two, c: true }
  //]

  //[derived

  BINLOG_INFO("Hierarchy: {}", Derived{});
  // Outputs: Hierarchy: Derived{ Base{ a: 0 }, b: 1, c: 2 }
  //]

  binlog::consume(std::cout);
  return 0;
}